

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  global_State *in_RSI;
  global_State *in_RDI;
  IRIns *ir;
  IRRef ref;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((short)(in_RSI->gc).total != 0) {
    for (uVar3 = (uint)(in_RSI->strbloom).cur[1]; uVar3 < 0x7ffd; uVar3 = uVar3 + 1) {
      puVar4 = (uint *)((in_RSI->strbloom).cur[0] + (ulong)uVar3 * 8);
      if ((*(char *)((long)puVar4 + 5) == '\x18') && ((*(byte *)((ulong)*puVar4 + 4) & 3) != 0)) {
        gc_mark(in_RSI,(GCobj *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
      }
      if (((0x604208U >> ((byte)puVar4[1] & 0x1f) & 1) != 0) &&
         (*(char *)((long)puVar4 + 5) != '\x1b')) {
        uVar3 = uVar3 + 1;
      }
    }
    if (*(short *)((long)&(in_RSI->gc).total + 2) != 0) {
      gc_marktrace(in_RDI,(uint)*(ushort *)((long)&(in_RSI->gc).total + 2));
    }
    if (*(short *)((long)&(in_RSI->gc).threshold + 2) != 0) {
      gc_marktrace(in_RDI,(uint)*(ushort *)((long)&(in_RSI->gc).threshold + 2));
    }
    sVar1._0_1_ = (in_RSI->gc).currentwhite;
    sVar1._1_1_ = (in_RSI->gc).state;
    if (sVar1 != 0) {
      uVar2._0_1_ = (in_RSI->gc).currentwhite;
      uVar2._1_1_ = (in_RSI->gc).state;
      gc_marktrace(in_RDI,(uint)uVar2);
    }
    if ((*(byte *)((ulong)(uint)in_RSI->strhash_hit + 4) & 3) != 0) {
      gc_mark(in_RSI,(GCobj *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
    if (irt_is64(ir->t) && ir->o != IR_KNULL)
      ref++;
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}